

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

_Bool Curl_host_is_ipnum(char *hostname)

{
  int iVar1;
  undefined1 local_2c [8];
  in6_addr in6;
  in_addr in;
  char *hostname_local;
  
  unique0x10000063 = hostname;
  iVar1 = inet_pton(2,hostname,(void *)((long)&in6.__in6_u + 8));
  if ((iVar1 < 1) && (iVar1 = inet_pton(10,stack0xffffffffffffffe8,local_2c), iVar1 < 1)) {
    return false;
  }
  return true;
}

Assistant:

bool Curl_host_is_ipnum(const char *hostname)
{
  struct in_addr in;
#ifdef USE_IPV6
  struct in6_addr in6;
#endif
  if(curlx_inet_pton(AF_INET, hostname, &in) > 0
#ifdef USE_IPV6
     || curlx_inet_pton(AF_INET6, hostname, &in6) > 0
#endif
    )
    return TRUE;
  return FALSE;
}